

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fctstr_endswith(char *str,char *check)

{
  size_t local_30;
  size_t str_i;
  size_t check_i;
  char *check_local;
  char *str_local;
  
  if ((str == (char *)0x0) && (check == (char *)0x0)) {
    str_local._4_4_ = 1;
  }
  else if (((str == (char *)0x0) && (check != (char *)0x0)) ||
          ((str != (char *)0x0 && (check == (char *)0x0)))) {
    str_local._4_4_ = 0;
  }
  else {
    str_i = strlen(check);
    local_30 = strlen(str);
    if (local_30 < str_i) {
      str_local._4_4_ = 0;
    }
    else {
      for (; str_i != 0; str_i = str_i - 1) {
        if (str[local_30] != check[str_i]) {
          return 0;
        }
        local_30 = local_30 - 1;
      }
      str_local._4_4_ = 1;
    }
  }
  return str_local._4_4_;
}

Assistant:

static int
fctstr_endswith(char const *str, char const *check)
{
    size_t check_i;
    size_t str_i;
    if ( str == NULL && check == NULL )
    {
        return 1;
    }
    else if ( ((str == NULL) && (check != NULL))
              || ((str != NULL) && (check == NULL)) )
    {
        return 0;
    }
    check_i = strlen(check);
    str_i = strlen(str);
    if ( str_i < check_i )
    {
        return 0;   /* Can't do it string is too small. */
    }
    for ( ; check_i != 0; --check_i, --str_i)
    {
        if ( str[str_i] != check[check_i] )
        {
            return 0; /* Found a case where they are not equal. */
        }
    }
    /* Exhausted check against string, can only be true. */
    return 1;
}